

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_new2(archive *a)

{
  archive_entry *entry;
  archive *a_local;
  
  a_local = (archive *)malloc(0x438);
  if (a_local == (archive *)0x0) {
    a_local = (archive *)0x0;
  }
  else {
    memset(a_local,0,0x438);
    *(archive **)a_local = a;
  }
  return (archive_entry *)a_local;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)malloc(sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	memset(entry, 0, sizeof(*entry));
	entry->archive = a;
	return (entry);
}